

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StartRoom.cpp
# Opt level: O0

void __thiscall StartRoom::StartRoom(StartRoom *this,string *rn,ItemTable *iList,bool sld)

{
  allocator local_69;
  string local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [39];
  byte local_21;
  ItemTable *pIStack_20;
  bool sld_local;
  ItemTable *iList_local;
  string *rn_local;
  StartRoom *this_local;
  
  local_21 = sld;
  pIStack_20 = iList;
  iList_local = (ItemTable *)rn;
  rn_local = (string *)this;
  Room::Room(&this->super_Room);
  (this->super_Room)._vptr_Room = (_func_int **)&PTR_getDescription_abi_cxx11__00155190;
  (this->super_Room).table = pIStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_68,
             "/workspace/llm4binary/github/license_all_cmakelists_25/originalname51[P]adventure_game/RoomDescriptions/"
             ,&local_69);
  std::operator+(local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_68);
  std::__cxx11::string::operator=((string *)&(this->super_Room).roomName,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  (this->super_Room).showLongDescription = (bool)(local_21 & 1);
  Room::parseData(&this->super_Room);
  return;
}

Assistant:

StartRoom::StartRoom(std::string rn, ItemTable *iList, bool sld) {
    table = iList;
    roomName = std::string(RESOURCES_PATH) + rn;
    showLongDescription = sld;
    parseData();

}